

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool bitset_container_add(bitset_container_t *bitset,uint16_t pos)

{
  uint64_t *puVar1;
  ulong uVar2;
  undefined6 in_register_00000032;
  ulong uVar3;
  
  puVar1 = bitset->words;
  uVar2 = CONCAT62(in_register_00000032,pos) >> 6 & 0x3ffffff;
  uVar3 = puVar1[uVar2] | 1L << ((ulong)pos & 0x3f);
  bitset->cardinality = bitset->cardinality + (int)((puVar1[uVar2] ^ uVar3) >> ((byte)pos & 0x3f));
  puVar1[uVar2] = uVar3;
  return SUB81(puVar1,0);
}

Assistant:

static inline bool bitset_container_add(bitset_container_t *bitset,
                                        uint16_t pos) {
    const uint64_t old_word = bitset->words[pos >> 6];
    const int index = pos & 63;
    const uint64_t new_word = old_word | (UINT64_C(1) << index);
    const uint64_t increment = (old_word ^ new_word) >> index;
    bitset->cardinality += (uint32_t)increment;
    bitset->words[pos >> 6] = new_word;
    return increment > 0;
}